

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternClip.cpp
# Opt level: O2

void __thiscall PatternClip::save(PatternClip *this,Pattern *src,PatternSelection region)

{
  size_t sVar1;
  pointer __p_00;
  size_t sVar2;
  size_t sVar3;
  TrackRow *pTVar4;
  ulong __n;
  char *__dest;
  int track;
  pointer __p;
  uint uVar5;
  TrackMeta TVar6;
  Iterator iter;
  char *local_68;
  Iterator local_50;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_38;
  
  (this->mLocation).mEnd.super_PatternCursorBase.column = region.mEnd.super_PatternCursorBase.column
  ;
  (this->mLocation).mEnd.super_PatternCursorBase.track = region.mEnd.super_PatternCursorBase.track;
  (this->mLocation).mStart.super_PatternCursorBase.row = region.mStart.super_PatternCursorBase.row;
  (this->mLocation).mStart.super_PatternCursorBase.column =
       region.mStart.super_PatternCursorBase.column;
  *(undefined8 *)&(this->mLocation).mStart.super_PatternCursorBase.track = region._8_8_;
  PatternSelection::iterator(&local_50,&this->mLocation);
  sVar1 = PatternClipTU::getRowLength(&local_50);
  __n = (long)((local_50.mEnd.super_PatternCursorBase.row -
               local_50.mStart.super_PatternCursorBase.row) + 1) * sVar1;
  __p_00 = (pointer)operator_new__(__n);
  memset(__p_00,0,__n);
  local_38._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0;
  std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
            ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)this,__p_00);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
  local_68 = (this->mData)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
  for (track = local_50.mStart.super_PatternCursorBase.track;
      track <= local_50.mEnd.super_PatternCursorBase.track; track = track + 1) {
    TVar6 = PatternSelection::Iterator::getTrackMeta(&local_50,track);
    sVar2 = PatternClipTU::columnToOffset(TVar6.mStart);
    sVar3 = PatternClipTU::columnToLength(TVar6.mEnd);
    __dest = local_68;
    for (uVar5 = local_50.mStart.super_PatternCursorBase.row;
        (int)uVar5 <= local_50.mEnd.super_PatternCursorBase.row; uVar5 = uVar5 + 1) {
      pTVar4 = trackerboy::Pattern::getTrackRow(src,(ChType)track,uVar5 & 0xffff);
      if ((int)sVar3 != (int)sVar2) {
        memmove(__dest,(void *)((long)((pTVar4->effects)._M_elems + -1) + sVar2),sVar3 - sVar2);
      }
      __dest = __dest + sVar1;
    }
    local_68 = local_68 + (sVar3 - sVar2);
  }
  return;
}

Assistant:

void PatternClip::save(trackerboy::Pattern const& src, PatternSelection region) {

    // before we do anything, check that the selection is within the bounds
    // of the given pattern
    #ifndef QT_NO_DEBUG
    {
        auto start = region.start();
        auto end = region.end();

        Q_ASSERT(start.isValid());
        Q_ASSERT(end.isValid());
        Q_ASSERT(start.row < src.size());
        Q_ASSERT(end.row < src.size());
    }
    #endif


    mLocation = region;
    auto const iter = mLocation.iterator();

    // determine the row length
    auto const rowLength = TU::getRowLength(iter);

    auto const bufsize = rowLength * iter.rows();
    Q_ASSERT(bufsize != 0);
    mData = std::make_unique<char[]>(bufsize);

    auto bufAtRowStart = mData.get();
    for (auto track = iter.trackStart(); track <= iter.trackEnd(); ++track) {
        auto const tmeta = iter.getTrackMeta(track);
        auto const offset = TU::columnToOffset(tmeta.columnStart());
        auto const length = TU::columnToLength(tmeta.columnEnd()) - offset;
        // with this assertion passing, we will never read or write past
        // the bounds of a TrackRow
        Q_ASSERT(offset + length <= sizeof(trackerboy::TrackRow));
        Q_ASSERT(length > 0); // if the length is 0 we aren't copying anything, consider this an error

        auto bufAtTrackStart = bufAtRowStart;
        for (int row = iter.rowStart(); row <= iter.rowEnd(); ++row) {
            auto &rowdata = src.getTrackRow(static_cast<trackerboy::ChType>(track), (uint16_t)row);
            std::copy_n(reinterpret_cast<const char*>(&rowdata) + offset, length, bufAtTrackStart);
            // advance to next row
            bufAtTrackStart += rowLength;
        }

        // advance to next track
        bufAtRowStart += length;
    }
}